

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O0

V * __thiscall linalg::mat<double,_4,_4>::operator[](mat<double,_4,_4> *this,int j)

{
  mat<double,_4,_4> *local_38;
  mat<double,_4,_4> *local_30;
  mat<double,_4,_4> *local_28;
  int j_local;
  mat<double,_4,_4> *this_local;
  
  local_28 = this;
  if (j != 0) {
    if (j == 1) {
      local_30 = (mat<double,_4,_4> *)&this->y;
    }
    else {
      if (j == 2) {
        local_38 = (mat<double,_4,_4> *)&this->z;
      }
      else {
        local_38 = (mat<double,_4,_4> *)&this->w;
      }
      local_30 = local_38;
    }
    local_28 = local_30;
  }
  return &local_28->x;
}

Assistant:

LINALG_CONSTEXPR14 V &      operator[] (int j)                  { return j==0?x:j==1?y:j==2?z:w; }